

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

Arch doctest::detail::Endianness::which(void)

{
  _ u;
  
  return Little;
}

Assistant:

static Arch which() {
            union _
            {
                int  asInt;
                char asChar[sizeof(int)];
            } u;

            u.asInt = 1;
            return (u.asChar[sizeof(int) - 1] == 1) ? Big : Little;
        }